

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

nng_err nng_http_server_set_error_page(nng_http_server *srv,nng_http_status code,char *body)

{
  nng_err nVar1;
  
  nVar1 = nni_http_server_set_error_page(srv,code,body);
  return nVar1;
}

Assistant:

nng_err
nng_http_server_set_error_page(
    nng_http_server *srv, nng_http_status code, const char *body)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_server_set_error_page(srv, code, body));
#else
	NNI_ARG_UNUSED(srv);
	NNI_ARG_UNUSED(code);
	NNI_ARG_UNUSED(body);
	return (NNG_ENOTSUP);
#endif
}